

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

void __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::
KinDynComputationsPrivateAttributes(KinDynComputationsPrivateAttributes *this)

{
  undefined1 *in_RDI;
  SpatialMomentum *in_stack_fffffffffffffed0;
  SpatialMotionVector local_78;
  Twist local_48 [72];
  
  iDynTree::Model::Model((Model *)(in_RDI + 8));
  iDynTree::Traversal::Traversal((Traversal *)(in_RDI + 0x138));
  iDynTree::LinkTraversalsCache::LinkTraversalsCache((LinkTraversalsCache *)(in_RDI + 0x198));
  iDynTree::FreeFloatingPos::FreeFloatingPos((FreeFloatingPos *)(in_RDI + 0x1b0));
  iDynTree::FreeFloatingVel::FreeFloatingVel((FreeFloatingVel *)(in_RDI + 0x238));
  iDynTree::Twist::Twist((Twist *)(in_RDI + 0x290));
  VectorFixSize<3U>::VectorFixSize((VectorFixSize<3U> *)(in_RDI + 0x2c0));
  VectorFixSize<3U>::VectorFixSize((VectorFixSize<3U> *)(in_RDI + 0x2d8));
  iDynTree::LinkPositions::LinkPositions((LinkPositions *)(in_RDI + 0x2f8),0);
  iDynTree::LinkVelArray::LinkVelArray((LinkVelArray *)(in_RDI + 0x310),0);
  iDynTree::LinkInertias::LinkInertias((LinkInertias *)(in_RDI + 0x330),0);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques
            ((FreeFloatingGeneralizedTorques *)(in_RDI + 0x348));
  iDynTree::FreeFloatingMassMatrix::FreeFloatingMassMatrix
            ((FreeFloatingMassMatrix *)(in_RDI + 0x3a8),0);
  SpatialMomentum::SpatialMomentum(in_stack_fffffffffffffed0);
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x408));
  SpatialAcc::SpatialAcc((SpatialAcc *)0x1d30d1);
  iDynTree::LinkAccArray::LinkAccArray((LinkAccArray *)(in_RDI + 0x468),0);
  SpatialAcc::SpatialAcc((SpatialAcc *)0x1d3106);
  iDynTree::FreeFloatingAcc::FreeFloatingAcc((FreeFloatingAcc *)(in_RDI + 0x4b0));
  iDynTree::LinkAccArray::LinkAccArray((LinkAccArray *)(in_RDI + 0x508),0);
  SpatialAcc::SpatialAcc((SpatialAcc *)0x1d3156);
  iDynTree::FreeFloatingAcc::FreeFloatingAcc((FreeFloatingAcc *)(in_RDI + 0x550));
  iDynTree::LinkAccArray::LinkAccArray((LinkAccArray *)(in_RDI + 0x5a8),0);
  iDynTree::LinkWrenches::LinkWrenches((LinkWrenches *)(in_RDI + 0x5c0),0);
  iDynTree::LinkWrenches::LinkWrenches((LinkWrenches *)(in_RDI + 0x5d8),0);
  iDynTree::FreeFloatingVel::FreeFloatingVel((FreeFloatingVel *)(in_RDI + 0x5f0));
  iDynTree::LinkVelArray::LinkVelArray((LinkVelArray *)(in_RDI + 0x648),0);
  iDynTree::LinkAccArray::LinkAccArray((LinkAccArray *)(in_RDI + 0x660),0);
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = 2;
  in_RDI[0x2f0] = 0;
  in_RDI[0x328] = 0;
  in_RDI[0x430] = 0;
  SpatialVector<iDynTree::SpatialMotionVector>::Zero();
  iDynTree::Twist::Twist(local_48,&local_78);
  iDynTree::Twist::operator=((Twist *)(in_RDI + 0x290),local_48);
  return;
}

Assistant:

KinDynComputationsPrivateAttributes()
    {
        m_isModelValid = false;
        m_frameVelRepr = MIXED_REPRESENTATION;
        m_isFwdKinematicsUpdated = false;
        m_isRawMassMatrixUpdated = false;
        m_areBiasAccelerationsUpdated = false;
        m_baseVelSetViaRobotState = iDynTree::Twist::Zero();
    }